

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticCost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::QuadraticCost::setControlHessianSparsity
          (QuadraticCost *this,SparsityStructure *controlSparsity)

{
  bool bVar1;
  SparsityStructure *in_RDI;
  SparsityStructure *in_stack_ffffffffffffffd8;
  
  bVar1 = SparsityStructure::isValid(in_RDI);
  if (bVar1) {
    *(undefined1 *)((long)&in_RDI[1].m_register._M_h._M_rehash_policy._M_max_load_factor + 1) = 1;
    SparsityStructure::operator=(in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    iDynTree::reportError
              ("QuadraticCost","setControlHessianSparsity",
               "The sparsity vectors have different number of entries.");
  }
  return bVar1;
}

Assistant:

bool QuadraticCost::setControlHessianSparsity(const SparsityStructure &controlSparsity)
        {
            if (!controlSparsity.isValid()) {
                reportError("QuadraticCost", "setControlHessianSparsity", "The sparsity vectors have different number of entries.");
                return false;
            }
            m_hasSecondPartialDerivativeWRTControlSparsity = true;
            m_secondPartialDerivativeWRTControlSparsity = controlSparsity;
            return true;
        }